

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMTLIB2.cpp
# Opt level: O3

void __thiscall Parse::SMTLIB2::colorSymbol(SMTLIB2 *this,string *name,Color color)

{
  pointer pcVar1;
  Entry *pEVar2;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined1 local_100 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  string local_70;
  char local_50 [32];
  
  pEVar2 = Lib::
           DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&this->_declaredSymbols,name);
  if (pEVar2 != (Entry *)0x0) {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_100._16_8_ = &local_e0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_100 + 0x10),pcVar1,pcVar1 + name->_M_string_length);
    pEVar2 = Lib::
             DHMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_Parse::SMTLIB2::SymbolType>,_Lib::DefaultHash,_Lib::DefaultHash2>
             ::findEntry(&this->_declaredSymbols,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_100 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._16_8_ != &local_e0) {
      operator_delete((void *)local_100._16_8_,local_e0._M_allocated_capacity + 1);
    }
    DAT_00b52200 = 1;
    Kernel::Signature::Symbol::addColor
              (*(Symbol **)
                (*(long *)(DAT_00b521b0 + 0x60 + (ulong)(pEVar2->_val).second * 0x20) +
                (ulong)(pEVar2->_val).first * 8),color);
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x50);
  std::operator+(&local_d0,"\'",name);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_b0 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar4;
  pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar4 + 2);
  if (__lhs == pbVar6) {
    local_100._0_8_ = (pbVar6->_M_dataplus)._M_p;
    local_100._8_8_ = plVar4[3];
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
  }
  else {
    local_100._0_8_ = (pbVar6->_M_dataplus)._M_p;
  }
  *plVar4 = (long)pbVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  Shell::LispParser::Expression::toString_abi_cxx11_(&local_70,this->_topLevelExpr,true);
  std::operator+(__lhs,in_stack_fffffffffffffee8);
  plVar4 = (long *)std::__cxx11::string::append(local_50);
  local_90 = (long *)*plVar4;
  plVar5 = plVar4 + 2;
  if (local_90 == plVar5) {
    local_80 = *plVar5;
    uStack_78 = (undefined4)plVar4[3];
    uStack_74 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  *puVar3 = &PTR_cry_00b3dfc0;
  puVar3[1] = puVar3 + 3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar3 + 1),local_90,local_88 + (long)local_90);
  *puVar3 = &PTR_cry_00b3e0a8;
  *(undefined4 *)(puVar3 + 5) = 0;
  puVar3[6] = puVar3 + 8;
  puVar3[7] = 0;
  *(undefined1 *)(puVar3 + 8) = 0;
  __cxa_throw(puVar3,&Lib::UserErrorException::typeinfo,Lib::UserErrorException::~UserErrorException
             );
}

Assistant:

void SMTLIB2::colorSymbol(const std::string& name, Color color)
{
  if (!_declaredSymbols.find(name)) {
    USER_ERROR_EXPR("'"+name+"' is not a user symbol");
  }
  DeclaredSymbol& s = _declaredSymbols.get(name);

  env.colorUsed = true;

  Signature::Symbol* sym = getSymbol(s);
  sym->addColor(color);
}